

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Pointer.cpp
# Opt level: O0

ostream * psy::C::operator<<(ostream *os,PointerType *ptrTy)

{
  ostream *os_00;
  Type *ty;
  PointerType *ptrTy_local;
  ostream *os_local;
  
  if (ptrTy == (PointerType *)0x0) {
    os_local = std::operator<<(os,"<PointerType is null>");
  }
  else {
    std::operator<<(os,"<PointerType | ");
    os_00 = std::operator<<(os," referenced-type:");
    ty = PointerType::referencedType(ptrTy);
    operator<<(os_00,ty);
    std::operator<<(os,">");
    os_local = os;
  }
  return os_local;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const PointerType* ptrTy)
{
    if (!ptrTy)
        return os << "<PointerType is null>";
    os << "<PointerType | ";
    os << " referenced-type:" << ptrTy->referencedType();
    os << ">";
    return os;
}